

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rotating_log.cpp
# Opt level: O0

void __thiscall RotatingLog_TwoRotations_Test::TestBody(RotatingLog_TwoRotations_Test *this)

{
  mock_file_system_traits *pmVar1;
  bool bVar2;
  MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pMVar3;
  TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pTVar4;
  MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode)>
  *this_00;
  TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode)>
  *this_01;
  MockSpec<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_02;
  TypedExpectation<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_03;
  MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_04;
  TypedExpectation<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_05;
  MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pMVar5;
  TypedExpectation<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pTVar6;
  ostream *this_06;
  long lVar7;
  char *message_00;
  AssertHelper local_bb0;
  Message local_ba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba0;
  undefined1 local_b80 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *m;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  value_type *local_b30;
  string *message;
  ostringstream str;
  uint local_9ac;
  long lStack_9a8;
  uint index;
  streamoff size;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_980;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_958;
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_940;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_918;
  MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_900;
  WithoutMatchers local_8c1;
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8c0;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_898;
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_880;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_858;
  MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_840;
  Cardinality local_808;
  WithoutMatchers local_7f1;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_7f0;
  MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_7d8;
  ReturnAction<bool> local_7b8;
  Action<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_7a8;
  WithoutMatchers local_781;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_780;
  MockSpec<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_768;
  WithoutMatchers local_741;
  Matcher<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_740;
  MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_728;
  WithoutMatchers local_701;
  Matcher<std::_Ios_Openmode> local_700;
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6e8;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_6c0;
  Matcher<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_6a8;
  MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode)>
  local_690;
  type local_63a;
  type local_639;
  Action<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_638;
  Cardinality local_618;
  WithoutMatchers local_601;
  Matcher<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_600;
  MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_5e8;
  mock_file_system_traits *local_5c8;
  mock_file_system_traits *file_system;
  mock_string_stream_traits *string_stream;
  mock_string_stream_traits local_4e0;
  allocator local_3f1;
  string local_3f0;
  undefined1 local_3d0 [8];
  log_type log;
  uint num_backups;
  streamoff max_size;
  RotatingLog_TwoRotations_Test *this_local;
  
  log.file_system_traits_.gmock02_rename_34.super_UntypedFunctionMockerBase.untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f0,"base_name",&local_3f1);
  anon_unknown.dwarf_1ece36::mock_string_stream_traits::mock_string_stream_traits(&local_4e0);
  anon_unknown.dwarf_1ece36::mock_file_system_traits::mock_file_system_traits
            ((mock_file_system_traits *)&string_stream);
  pstore::
  basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
  ::basic_rotating_log
            ((basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
              *)local_3d0,&local_3f0,100,2,&local_4e0,(mock_file_system_traits *)&string_stream);
  anon_unknown.dwarf_1ece36::mock_file_system_traits::~mock_file_system_traits
            ((mock_file_system_traits *)&string_stream);
  anon_unknown.dwarf_1ece36::mock_string_stream_traits::~mock_string_stream_traits(&local_4e0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  file_system = (mock_file_system_traits *)
                pstore::
                basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
                ::stream_traits((basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
                                 *)local_3d0);
  local_5c8 = pstore::
              basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
              ::file_system_traits
                        ((basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
                          *)local_3d0);
  pmVar1 = file_system;
  testing::Matcher<std::__cxx11::ostringstream&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<std::__cxx11::ostringstream&> *)&local_600,(AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_1ece36::mock_string_stream_traits::gmock_clear
            (&local_5e8,(mock_string_stream_traits *)pmVar1,&local_600);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::
           MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::operator()(&local_5e8,&local_601,(void *)0x0);
  pTVar4 = testing::internal::
           MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::InternalExpectedAt
                     (pMVar3,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_rotating_log.cpp"
                      ,0x6c,"string_stream","clear (_)");
  testing::AnyNumber();
  pTVar4 = testing::internal::
           TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::Times(pTVar4,&local_618);
  testing::Invoke<RotatingLog_TwoRotations_Test::TestBody()::__0>(&local_63a);
  testing::Action<void(std::__cxx11::ostringstream&)>::
  Action<RotatingLog_TwoRotations_Test::TestBody()::__0,void>
            ((Action<void(std::__cxx11::ostringstream&)> *)&local_638,&local_639);
  testing::internal::
  TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::WillRepeatedly(pTVar4,&local_638);
  testing::
  Action<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~Action(&local_638);
  testing::Cardinality::~Cardinality(&local_618);
  testing::internal::
  MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~MockSpec(&local_5e8);
  testing::
  Matcher<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~Matcher(&local_600);
  pmVar1 = file_system;
  testing::Matcher<std::__cxx11::ostringstream&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<std::__cxx11::ostringstream&> *)&local_6a8,(AnythingMatcher *)&testing::_);
  testing::StrEq<char[10]>(&local_6e8,(StringLike<char[10]> *)"base_name");
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_6c0,(PolymorphicMatcher *)&local_6e8)
  ;
  testing::Matcher<std::_Ios_Openmode>::Matcher<testing::internal::AnythingMatcher_const&,void>
            (&local_700,(AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_1ece36::mock_string_stream_traits::gmock_open
            (&local_690,(mock_string_stream_traits *)pmVar1,&local_6a8,&local_6c0,&local_700);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode)>
            ::operator()(&local_690,&local_701,(void *)0x0);
  this_01 = testing::internal::
            MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode)>
            ::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_rotating_log.cpp"
                       ,0x70,"string_stream","open (_, StrEq (\"base_name\"), _)");
  testing::internal::
  TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode)>
  ::Times(this_01,3);
  testing::internal::
  MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode)>
  ::~MockSpec(&local_690);
  testing::Matcher<std::_Ios_Openmode>::~Matcher(&local_700);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_6c0);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher(&local_6e8);
  testing::
  Matcher<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~Matcher(&local_6a8);
  pmVar1 = file_system;
  testing::Matcher<std::__cxx11::ostringstream&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<std::__cxx11::ostringstream&> *)&local_740,(AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_1ece36::mock_string_stream_traits::gmock_close
            (&local_728,(mock_string_stream_traits *)pmVar1,&local_740);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::
           MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::operator()(&local_728,&local_741,(void *)0x0);
  pTVar4 = testing::internal::
           MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::InternalExpectedAt
                     (pMVar3,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_rotating_log.cpp"
                      ,0x71,"string_stream","close (_)");
  testing::internal::
  TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::Times(pTVar4,3);
  testing::internal::
  MockSpec<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~MockSpec(&local_728);
  testing::
  Matcher<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~Matcher(&local_740);
  pmVar1 = local_5c8;
  testing::Matcher<std::__cxx11::string_const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<std::__cxx11::string_const&> *)&local_780,(AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_1ece36::mock_file_system_traits::gmock_exists(&local_768,pmVar1,&local_780);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::
            MockSpec<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()(&local_768,&local_781,(void *)0x0);
  this_03 = testing::internal::
            MockSpec<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::InternalExpectedAt
                      (this_02,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_rotating_log.cpp"
                       ,0x73,"file_system","exists (_)");
  testing::Return<bool>((testing *)&local_7b8,true);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_7a8,(ReturnAction *)&local_7b8);
  testing::internal::
  TypedExpectation<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::WillRepeatedly(this_03,&local_7a8);
  testing::
  Action<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~Action(&local_7a8);
  testing::internal::ReturnAction<bool>::~ReturnAction(&local_7b8);
  testing::internal::
  MockSpec<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~MockSpec(&local_768);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_780);
  pmVar1 = local_5c8;
  testing::Matcher<std::__cxx11::string_const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<std::__cxx11::string_const&> *)&local_7f0,(AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_1ece36::mock_file_system_traits::gmock_unlink(&local_7d8,pmVar1,&local_7f0);
  testing::internal::GetWithoutMatchers();
  this_04 = testing::internal::
            MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()(&local_7d8,&local_7f1,(void *)0x0);
  this_05 = testing::internal::
            MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::InternalExpectedAt
                      (this_04,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_rotating_log.cpp"
                       ,0x74,"file_system","unlink (_)");
  testing::AnyNumber();
  testing::internal::
  TypedExpectation<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::Times(this_05,&local_808);
  testing::Cardinality::~Cardinality(&local_808);
  testing::internal::
  MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~MockSpec(&local_7d8);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_7f0);
  pmVar1 = local_5c8;
  testing::StrEq<char[12]>(&local_880,(StringLike<char[12]> *)"base_name.1");
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_858,(PolymorphicMatcher *)&local_880)
  ;
  testing::StrEq<char[12]>(&local_8c0,(StringLike<char[12]> *)"base_name.2");
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_898,(PolymorphicMatcher *)&local_8c0)
  ;
  anon_unknown.dwarf_1ece36::mock_file_system_traits::gmock_rename
            (&local_840,pmVar1,&local_858,&local_898);
  testing::internal::GetWithoutMatchers();
  pMVar5 = testing::internal::
           MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::operator()(&local_840,&local_8c1,(void *)0x0);
  pTVar6 = testing::internal::
           MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::InternalExpectedAt
                     (pMVar5,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_rotating_log.cpp"
                      ,0x75,"file_system",
                      "rename (StrEq (\"base_name.1\"), StrEq (\"base_name.2\"))");
  testing::internal::
  TypedExpectation<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::Times(pTVar6,2);
  testing::internal::
  MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~MockSpec(&local_840);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_898);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher(&local_8c0);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_858);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher(&local_880);
  pmVar1 = local_5c8;
  testing::StrEq<char[10]>(&local_940,(StringLike<char[10]> *)"base_name");
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_918,(PolymorphicMatcher *)&local_940)
  ;
  testing::StrEq<char[12]>(&local_980,(StringLike<char[12]> *)"base_name.1");
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_958,(PolymorphicMatcher *)&local_980)
  ;
  anon_unknown.dwarf_1ece36::mock_file_system_traits::gmock_rename
            (&local_900,pmVar1,&local_918,&local_958);
  testing::internal::GetWithoutMatchers();
  pMVar5 = testing::internal::
           MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::operator()(&local_900,
                        (WithoutMatchers *)
                        ((long)&messages.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),(void *)0x0)
  ;
  pTVar6 = testing::internal::
           MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::InternalExpectedAt
                     (pMVar5,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_rotating_log.cpp"
                      ,0x76,"file_system","rename (StrEq (\"base_name\"), StrEq (\"base_name.1\"))")
  ;
  testing::internal::
  TypedExpectation<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::Times(pTVar6,2);
  testing::internal::
  MockSpec<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~MockSpec(&local_900);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_958);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher(&local_980);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_918);
  testing::
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher(&local_940);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&size);
  lStack_9a8 = 0;
  local_9ac = 1;
  while (lStack_9a8 < 200) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&message);
    this_06 = std::operator<<((ostream *)&message,"message ");
    std::ostream::operator<<(this_06,local_9ac);
    std::__cxx11::ostringstream::str();
    local_b30 = (value_type *)&__range1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&size,local_b30);
    lVar7 = std::__cxx11::string::size();
    lStack_9a8 = lVar7 + lStack_9a8;
    local_9ac = local_9ac + 1;
    std::__cxx11::string::~string((string *)&__range1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&message);
  }
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&size);
  m = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&size);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&m), bVar2) {
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )__gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
    pstore::
    basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
    ::log_impl((basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
                *)local_3d0,
               (string *)
               gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  pstore::
  basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,(anonymous_namespace)::mock_file_system_traits>
  ::stream_abi_cxx11_((basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,(anonymous_namespace)::mock_file_system_traits>
                       *)local_3d0);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper::
  Compare<char[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_b80,"\"message 21\"","log.stream ().str ()",
             (char (*) [11])"message 21",&local_ba0);
  std::__cxx11::string::~string((string *)&local_ba0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b80);
  if (!bVar2) {
    testing::Message::Message(&local_ba8);
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_b80);
    testing::internal::AssertHelper::AssertHelper
              (&local_bb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_rotating_log.cpp"
               ,0x90,message_00);
    testing::internal::AssertHelper::operator=(&local_bb0,&local_ba8);
    testing::internal::AssertHelper::~AssertHelper(&local_bb0);
    testing::Message::~Message(&local_ba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&size);
  pstore::
  basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
  ::~basic_rotating_log
            ((basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
              *)local_3d0);
  return;
}

Assistant:

TEST (RotatingLog, TwoRotations) {
    using ::testing::_;
    using ::testing::AnyNumber;
    using ::testing::Invoke;
    using ::testing::Return;
    using ::testing::StrEq;

    using log_type = pstore::basic_rotating_log<mock_string_stream_traits, mock_file_system_traits>;

    // We'll contrive two rollovers by generating at least max_size * num_backups
    // worth of output.
    constexpr auto max_size = std::streamoff{100};
    constexpr auto num_backups = 2U;
    log_type log ("base_name", max_size, num_backups);

    // Check that the rollover process renames bn1->bn2 and bn->bn1 twice each (once
    // for each rollover. I also check that we open the real output file three times;
    // that is, two rollovers and a partially filled third file.
    {
        auto & string_stream = log.stream_traits ();
        auto & file_system = log.file_system_traits ();

        // I need the clear() method to really clear the stream contents.
        EXPECT_CALL (string_stream, clear (_))
            .Times (AnyNumber ())
            .WillRepeatedly (Invoke ([] (std::ostringstream & os) { os.str (""); }));

        EXPECT_CALL (string_stream, open (_, StrEq ("base_name"), _)).Times (3);
        EXPECT_CALL (string_stream, close (_)).Times (3);

        EXPECT_CALL (file_system, exists (_)).WillRepeatedly (Return (true));
        EXPECT_CALL (file_system, unlink (_)).Times (AnyNumber ());
        EXPECT_CALL (file_system, rename (StrEq ("base_name.1"), StrEq ("base_name.2"))).Times (2);
        EXPECT_CALL (file_system, rename (StrEq ("base_name"), StrEq ("base_name.1"))).Times (2);
    }

    // Put together an array of strings which contain "message" followed by the decimal offset
    // of the string. We want one more than will fit in "max_size" bytes (not including line
    // feeds).
    std::vector<std::string> messages;
    {
        auto size = std::streamoff{0};
        auto index = 1U;
        while (size < max_size * num_backups) {
            std::ostringstream str;
            str << "message " << index;
            std::string const & message = str.str ();
            messages.push_back (message);

            size += message.size ();
            ++index;
        }
    }
    // Now log each of the strings.
    for (auto const & m : messages) {
        log.log_impl (m);
    }

    // A single copy of the string is left in the active "file".
    EXPECT_EQ ("message 21", log.stream ().str ());
}